

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O0

int AF_A_WraithChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte bVar1;
  AActor *this;
  DObject *this_00;
  bool bVar2;
  double newz;
  bool local_52;
  bool local_4f;
  int weaveindex;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                  ,0xf5,"int AF_A_WraithChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this = (AActor *)(param->field_0).field_1.a;
    local_4f = true;
    if (this != (AActor *)0x0) {
      local_4f = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_4f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                    ,0xf5,"int AF_A_WraithChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
        bVar2 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0xf5,"int AF_A_WraithChase(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      this_00 = (DObject *)param[1].field_0.field_1.a;
      local_52 = true;
      if (this_00 != (DObject *)0x0) {
        local_52 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
      }
      if (local_52 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0xf5,"int AF_A_WraithChase(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
        bVar2 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0xf5,"int AF_A_WraithChase(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    bVar1 = this->WeaveIndexZ;
    newz = BobSin((double)bVar1);
    AActor::AddZ(this,newz,true);
    this->WeaveIndexZ = bVar1 + 2 & 0x3f;
    A_Chase(stack,this);
    A_WraithFX4(this);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0xf5,"int AF_A_WraithChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithChase)
{
	PARAM_ACTION_PROLOGUE;

	int weaveindex = self->WeaveIndexZ;
	self->AddZ(BobSin(weaveindex));
	self->WeaveIndexZ = (weaveindex + 2) & 63;
//	if (self->Floorclip > 0)
//	{
//		P_SetMobjState(self, S_WRAITH_RAISE2);
//		return;
//	}
	A_Chase (stack, self);
	A_WraithFX4 (self);
	return 0;
}